

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O0

JsErrorCode
JsGetPropertyIdFromNameInternal(WCHAR *name,size_t cPropertyNameLength,JsPropertyIdRef *propertyId)

{
  anon_class_24_3_e1295a6b fn;
  JsErrorCode JVar1;
  JsPropertyIdRef *local_20;
  JsPropertyIdRef *propertyId_local;
  size_t cPropertyNameLength_local;
  WCHAR *name_local;
  
  fn.propertyId = &local_20;
  fn.name = (WCHAR **)&cPropertyNameLength_local;
  fn.cPropertyNameLength = (size_t *)&propertyId_local;
  local_20 = propertyId;
  propertyId_local = (JsPropertyIdRef *)cPropertyNameLength;
  cPropertyNameLength_local = (size_t)name;
  JVar1 = ContextAPINoScriptWrapper_NoRecord<JsGetPropertyIdFromNameInternal(char16_t_const*,unsigned_long,void**)::_lambda(Js::ScriptContext*)_1_>
                    (fn,false,false);
  return JVar1;
}

Assistant:

inline JsErrorCode JsGetPropertyIdFromNameInternal(_In_z_ const WCHAR *name, size_t cPropertyNameLength, _Out_ JsPropertyIdRef *propertyId)
{
    return ContextAPINoScriptWrapper_NoRecord([&](Js::ScriptContext * scriptContext) -> JsErrorCode {
        PARAM_NOT_NULL(name);
        PARAM_NOT_NULL(propertyId);
        *propertyId = nullptr;

        if (cPropertyNameLength <= INT_MAX)
        {
            scriptContext->GetOrAddPropertyRecord(name, static_cast<int>(cPropertyNameLength), (Js::PropertyRecord const **)propertyId);

            return JsNoError;
        }
        else
        {
            return JsErrorOutOfMemory;
        }
    });
}